

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 953_alienDictionary.cpp
# Opt level: O1

bool isAlienSorted(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *words,string *order)

{
  bool bVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  ulong uVar4;
  string word2;
  string word1;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> m;
  string local_110;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  string local_b0;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_90;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_60;
  
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = 0;
  local_f0 = &local_e0;
  local_e8 = 0;
  local_e0 = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if (order->_M_string_length != 0) {
    uVar3 = 0;
    do {
      pmVar2 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
               operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                           *)&local_90,(order->_M_dataplus)._M_p + uVar3);
      *pmVar2 = (mapped_type)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar3 < order->_M_string_length);
  }
  uVar3 = 0xffffffffffffffff;
  do {
    uVar4 = ((long)(words->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(words->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
    uVar3 = uVar3 + 1;
    if (uVar4 <= uVar3) break;
    std::__cxx11::string::_M_assign((string *)&local_d0);
    std::__cxx11::string::_M_assign((string *)&local_f0);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_d0,local_d0 + local_c8);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_f0,local_f0 + local_e8);
    std::
    _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
    ::_Rb_tree(&local_60,&local_90);
    bVar1 = isAdjacentSorted(&local_b0,&local_110,
                             (map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                              *)&local_60);
    std::
    _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
    ::~_Rb_tree(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  } while (bVar1);
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree(&local_90);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return uVar4 <= uVar3;
}

Assistant:

bool isAlienSorted(vector<string>& words, string order) {
    string word1,word2;
	map<char,int> m;
	for (size_t i=0; i<order.length(); i++)
	{
		m[order[i]] = i;
	}
    for (int i=0; i<words.size()-1; i++)
    {
    	word1 = words[i];
    	word2 = words[i+1];
	    if (!isAdjacentSorted(word1,word2,m))
	    	return false;
    }
    return true;
}